

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall ProxyListener::~ProxyListener(ProxyListener *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_OscPacketListener).super_PacketListener._vptr_PacketListener =
       (_func_int **)&PTR__ProxyListener_0010c9b8;
  pcVar1 = (this->host_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->host_).field_2) {
    operator_delete(pcVar1);
  }
  this_00 = (this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this);
  return;
}

Assistant:

ProxyListener(const std::string &host, unsigned port)
            : host_(host), port_(port) {
        buffer_[0] = 0;
        if (host.length() > 0) {
            connect(host, port);
        }
    }